

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kotak.h
# Opt level: O0

void __thiscall Kotak::Kotak(Kotak *this,Point<double> *a,Point<double> *b)

{
  Point<double> local_60;
  Point<double> local_48;
  Point<double> *local_20;
  Point<double> *b_local;
  Point<double> *a_local;
  Kotak *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (Point<double> *)this;
  Polygon::Polygon(&this->super_Polygon);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_48,b->x,a->y,0.0);
  Polygon::addPoint((Point_conflict *)this);
  Polygon::addPoint((Point_conflict *)this);
  Point<double>::Point(&local_60,a->x,b->y,0.0);
  Polygon::addPoint((Point_conflict *)this);
  return;
}

Assistant:

Kotak(Point<double> a, Point<double> b) {
    addPoint(a);
    addPoint(Point<double>(b.x, a.y));
    addPoint(b);
    addPoint(Point<double>(a.x, b.y));
  }